

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets_smart.cpp
# Opt level: O0

void calcola_wavelet_minus(vector<double,_std::allocator<double>_> *v,string *stringa)

{
  double dVar1;
  ulong uVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  ulong local_5a0;
  size_t i_3;
  ostream local_578 [8];
  ofstream ofi;
  ostringstream local_378 [8];
  ostringstream ostring3;
  double local_200;
  ulong local_1f8;
  size_t i_2;
  ulong local_1e8;
  size_t i_1;
  double local_1c8;
  double m;
  undefined1 local_1b8 [4];
  int i;
  vector<double,_std::allocator<double>_> first;
  int size;
  ostringstream local_190 [8];
  ostringstream ostring;
  string *stringa_local;
  vector<double,_std::allocator<double>_> *v_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"wavelet_");
  poVar3 = std::operator<<(poVar3,(string *)stringa);
  std::operator<<(poVar3,".txt");
  sVar4 = std::vector<double,_std::allocator<double>_>::size(v);
  first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = (int)sVar4;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(&v_coeff_w_plus);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(&v_coeff_w_minus);
  std::vector<double,_std::allocator<double>_>::clear(&variance_plus);
  std::vector<double,_std::allocator<double>_>::clear(&variance_minus);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_1b8);
  for (m._4_4_ = 0;
      m._4_4_ < (int)first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 1; m._4_4_ = m._4_4_ + 2) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](v,(long)m._4_4_);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](v,(long)(m._4_4_ + 1));
    local_1c8 = (dVar1 + *pvVar5) * 0.5;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_1b8,&local_1c8);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i_1,
             (vector<double,_std::allocator<double>_> *)local_1b8);
  wavelet_pass_minus((vector<double,_std::allocator<double>_> *)&i_1);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i_1);
  local_1e8 = 0;
  while( true ) {
    uVar2 = local_1e8;
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&v_coeff_w_plus);
    if (sVar4 <= uVar2) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&v_coeff_w_plus,local_1e8);
    i_2 = (size_t)varianza<double>(pvVar6);
    std::vector<double,_std::allocator<double>_>::push_back(&variance_plus,(value_type *)&i_2);
    local_1e8 = local_1e8 + 1;
  }
  local_1f8 = 0;
  while( true ) {
    uVar2 = local_1f8;
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&v_coeff_w_minus);
    if (sVar4 <= uVar2) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&v_coeff_w_minus,local_1f8);
    local_200 = varianza<double>(pvVar6);
    std::vector<double,_std::allocator<double>_>::push_back(&variance_minus,&local_200);
    local_1f8 = local_1f8 + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_378);
  poVar3 = std::operator<<((ostream *)local_378,"wavelet_");
  poVar3 = std::operator<<(poVar3,(string *)stringa);
  std::operator<<(poVar3,"coeff.txt");
  std::__cxx11::ostringstream::str();
  std::ofstream::ofstream(local_578,&i_3,0x10);
  std::__cxx11::string::~string((string *)&i_3);
  local_5a0 = 0;
  while( true ) {
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&variance_plus);
    if (sVar4 <= local_5a0) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&v_coeff_w_plus,local_5a0);
    sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
    poVar3 = (ostream *)std::ostream::operator<<(local_578,sVar4);
    poVar3 = std::operator<<(poVar3,"\t");
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&variance_plus,local_5a0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar5);
    poVar3 = std::operator<<(poVar3,"\t");
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&variance_minus,local_5a0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_5a0 = local_5a0 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_578);
  std::__cxx11::ostringstream::~ostringstream(local_378);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void calcola_wavelet_minus(vector<double> v, string stringa) {
	ostringstream ostring;
	ostring << "wavelet_" << stringa << ".txt";
	int size = v.size(); 

	v_coeff_w_plus.clear();
	v_coeff_w_minus.clear();
	variance_plus.clear();
	variance_minus.clear();

	vector<double> first;
	for(int i = 0; i < size + 1; i += 2) {
		double m = (v[i] + v[i + 1]) / 2.;
		first.push_back(m);
	};

	wavelet_pass_minus(first);


	for(size_t i = 0; i < v_coeff_w_plus.size(); i++)variance_plus.push_back(varianza(v_coeff_w_plus[i]));

	for(size_t i = 0; i < v_coeff_w_minus.size(); i++)variance_minus.push_back(varianza(v_coeff_w_minus[i]));
	
	//ofstream ofi_coeff_p("coeff_plus.txt");

	//for(int i = 0; i < v_coeff_w_plus.size(); i++) {
	//	for(int j = 0; j < v_coeff_w_plus[i].size(); j++)ofi_coeff_p << v_coeff_w_plus[i][j] << " ";
	//	ofi_coeff_p << endl;
	//}

	ostringstream ostring3;
	ostring3 << "wavelet_" << stringa << "coeff.txt";
	ofstream ofi(ostring3.str());
	for(size_t i = 0; i < variance_plus.size(); i++)ofi << v_coeff_w_plus[i].size() << "\t" << variance_plus[i] << "\t" << variance_minus[i] << endl;
	ofi.close();

}